

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O2

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<11,_5,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  Type in0;
  undefined1 local_8c [20];
  float local_78;
  float local_74;
  Vector<float,_3> local_70;
  tcu local_64 [12];
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  VecAccess<float,_4,_3> local_38;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<2,5>
              ((ShaderEvalContext *)local_8c,(int)evalCtx);
  }
  else {
    tcu::Matrix<float,_2,_2>::Matrix
              ((Matrix<float,_2,_2> *)local_8c,(float *)sr::(anonymous_namespace)::s_constInMat2x2);
  }
  sr::(anonymous_namespace)::MatrixCaseUtils::increment<float,2,2>
            ((MatrixCaseUtils *)&local_48,(Matrix<float,_2,_2> *)local_8c);
  local_70.m_data[2] = local_44 + local_3c;
  local_70.m_data[0] = local_48;
  local_70.m_data[1] = local_40;
  sr::(anonymous_namespace)::MatrixCaseUtils::increment<float,2,2>
            ((MatrixCaseUtils *)&local_58,(Matrix<float,_2,_2> *)local_8c);
  local_74 = local_54 + local_4c;
  local_8c._16_4_ = local_58;
  local_78 = local_50;
  tcu::operator+(local_64,&local_70,(Vector<float,_3> *)(local_8c + 0x10));
  local_38.m_vector = &evalCtx->color;
  local_38.m_index[0] = 0;
  local_38.m_index[1] = 1;
  local_38.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_38,(Vector<float,_3> *)local_64);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);

		// modifying reduction: sum modified value too
		evalCtx.color.xyz() = reduceToVec3(increment(in0)) + reduceToVec3(increment(in0));
	}